

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QCss::StyleRule>::reallocateAndGrow
          (QArrayDataPointer<QCss::StyleRule> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QCss::StyleRule> *old)

{
  long lVar1;
  bool bVar2;
  QGenericArrayOps<QCss::StyleRule> *this_00;
  StyleRule *b;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  QArrayDataPointer<QCss::StyleRule> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QCss::StyleRule> dp;
  undefined4 in_stack_ffffffffffffff78;
  AllocationOption in_stack_ffffffffffffff7c;
  StyleRule *in_stack_ffffffffffffff80;
  StyleRule *in_stack_ffffffffffffff88;
  QGenericArrayOps<QCss::StyleRule> *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((in_ESI != 0) || (in_RCX != 0)) ||
      (bVar2 = needsDetach((QArrayDataPointer<QCss::StyleRule> *)in_stack_ffffffffffffff80), bVar2))
     || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QCss::StyleRule> *)&DAT_aaaaaaaaaaaaaaaa,-0x5555555555555556,
                 0xaaaaaaaa);
    if (0 < in_RDX) {
      qt_noop();
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach((QArrayDataPointer<QCss::StyleRule> *)in_stack_ffffffffffffff80);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QGenericArrayOps<QCss::StyleRule> *)
                  operator->((QArrayDataPointer<QCss::StyleRule> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QCss::StyleRule> *)0x48b28c);
        begin((QArrayDataPointer<QCss::StyleRule> *)0x48b29b);
        QtPrivate::QGenericArrayOps<QCss::StyleRule>::copyAppend
                  (this_00,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      }
      else {
        in_stack_ffffffffffffff80 =
             (StyleRule *)operator->((QArrayDataPointer<QCss::StyleRule> *)&stack0xffffffffffffffe0)
        ;
        b = begin((QArrayDataPointer<QCss::StyleRule> *)0x48b2d1);
        begin((QArrayDataPointer<QCss::StyleRule> *)0x48b2e0);
        QtPrivate::QGenericArrayOps<QCss::StyleRule>::moveAppend
                  (in_stack_ffffffffffffff90,b,in_stack_ffffffffffffff80);
      }
    }
    swap((QArrayDataPointer<QCss::StyleRule> *)in_stack_ffffffffffffff80,
         (QArrayDataPointer<QCss::StyleRule> *)
         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (in_RCX != 0) {
      swap((QArrayDataPointer<QCss::StyleRule> *)in_stack_ffffffffffffff80,
           (QArrayDataPointer<QCss::StyleRule> *)
           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    ~QArrayDataPointer((QArrayDataPointer<QCss::StyleRule> *)in_stack_ffffffffffffff80);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity((QArrayDataPointer<QCss::StyleRule> *)in_stack_ffffffffffffff80);
    freeSpaceAtEnd((QArrayDataPointer<QCss::StyleRule> *)in_stack_ffffffffffffff88);
    QtPrivate::QMovableArrayOps<QCss::StyleRule>::reallocate
              ((QMovableArrayOps<QCss::StyleRule> *)in_stack_ffffffffffffff88,
               (qsizetype)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }